

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O3

void __thiscall QTextFramePrivate::remove_me(QTextFramePrivate *this)

{
  undefined8 *puVar1;
  QTextObject *object;
  QTextFrame *pQVar2;
  QTextFrame *pQVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  QPodArrayOps<QTextFrame*> *this_00;
  long in_FS_OFFSET;
  QTextFrame *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  object = *(QTextObject **)&(this->super_QTextObjectPrivate).field_0x8;
  pQVar3 = this->parentFrame;
  if (pQVar3 == (QTextFrame *)0x0 &&
      (this->fragment_end == 0 && *(int *)&(this->super_QTextObjectPrivate).field_0x84 == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QTextDocumentPrivate::deleteObject
                (*(QTextDocumentPrivate **)(*(long *)(*(long *)&object->field_0x8 + 0x10) + 8),
                 object);
      return;
    }
  }
  else {
    if (pQVar3 != (QTextFrame *)0x0) {
      lVar5 = *(long *)&(pQVar3->super_QTextObject).field_0x8;
      if (*(long *)(lVar5 + 0xa8) == 0) {
LAB_00529551:
        iVar4 = -1;
      }
      else {
        iVar4 = -1;
        lVar6 = 0;
        do {
          if (*(long *)(lVar5 + 0xa8) << 3 == lVar6) goto LAB_00529551;
          iVar4 = iVar4 + 1;
          puVar1 = (undefined8 *)(*(long *)(lVar5 + 0xa0) + lVar6);
          lVar6 = lVar6 + 8;
        } while ((QTextObject *)*puVar1 != object);
      }
      if ((this->childFrames).d.size != 0) {
        uVar7 = 0;
        do {
          this_00 = (QPodArrayOps<QTextFrame*> *)
                    (*(long *)&(pQVar3->super_QTextObject).field_0x8 + 0x98);
          pQVar2 = (this->childFrames).d.ptr[uVar7];
          local_40 = pQVar2;
          QtPrivate::QPodArrayOps<QTextFrame*>::emplace<QTextFrame*&>
                    (this_00,uVar7 + (long)iVar4,&local_40);
          QList<QTextFrame_*>::begin((QList<QTextFrame_*> *)this_00);
          pQVar3 = this->parentFrame;
          *(QTextFrame **)(*(long *)&(pQVar2->super_QTextObject).field_0x8 + 0x90) = pQVar3;
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)(this->childFrames).d.size);
        iVar4 = iVar4 + (int)uVar7;
        lVar5 = *(long *)&(pQVar3->super_QTextObject).field_0x8;
      }
      QList<QTextFrame_*>::removeAt((QList<QTextFrame_*> *)(lVar5 + 0x98),(long)iVar4);
      QList<QTextFrame_*>::clear(&this->childFrames);
      this->parentFrame = (QTextFrame *)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QTextFramePrivate::remove_me()
{
    Q_Q(QTextFrame);
    if (fragment_start == 0 && fragment_end == 0
        && !parentFrame) {
        QTextDocumentPrivate::get(q->document())->deleteObject(q);
        return;
    }

    if (!parentFrame)
        return;

    int index = parentFrame->d_func()->childFrames.indexOf(q);

    // iterator over all children and move them to the parent
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *c = childFrames.at(i);
        parentFrame->d_func()->childFrames.insert(index, c);
        c->d_func()->parentFrame = parentFrame;
        ++index;
    }
    Q_ASSERT(parentFrame->d_func()->childFrames.at(index) == q);
    parentFrame->d_func()->childFrames.removeAt(index);

    childFrames.clear();
    parentFrame = nullptr;
}